

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_detection.cpp
# Opt level: O1

BlobInfo * __thiscall
Blob_Detection::BlobDetection::getBestBlob(BlobDetection *this,BlobCriterion criterion)

{
  BlobInfo *pBVar1;
  BlobInfo *pBVar2;
  imageException *this_00;
  BlobInfo *pBVar3;
  BlobInfo *pBVar4;
  
  switch(criterion) {
  case CRITERION_CIRCULARITY:
    pBVar2 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar1 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pBVar3 = pBVar2 + 1;
    pBVar4 = pBVar2;
    if (pBVar3 != pBVar1 && pBVar2 != pBVar1) {
      do {
        pBVar2 = pBVar3;
        if ((pBVar3->_circularity).value <= (pBVar4->_circularity).value) {
          pBVar2 = pBVar4;
        }
        pBVar3 = pBVar3 + 1;
        pBVar4 = pBVar2;
      } while (pBVar3 != pBVar1);
    }
    break;
  case CRITERION_ELONGATION:
    pBVar2 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar1 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pBVar3 = pBVar2 + 1;
    pBVar4 = pBVar2;
    if (pBVar3 != pBVar1 && pBVar2 != pBVar1) {
      do {
        pBVar2 = pBVar3;
        if ((pBVar3->_elongation).value <= (pBVar4->_elongation).value) {
          pBVar2 = pBVar4;
        }
        pBVar3 = pBVar3 + 1;
        pBVar4 = pBVar2;
      } while (pBVar3 != pBVar1);
    }
    break;
  case CRITERION_HEIGHT:
    pBVar2 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar1 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pBVar3 = pBVar2 + 1;
    pBVar4 = pBVar2;
    if (pBVar3 != pBVar1 && pBVar2 != pBVar1) {
      do {
        pBVar2 = pBVar3;
        if ((pBVar3->_height).value <= (pBVar4->_height).value) {
          pBVar2 = pBVar4;
        }
        pBVar3 = pBVar3 + 1;
        pBVar4 = pBVar2;
      } while (pBVar3 != pBVar1);
    }
    break;
  case CRITERION_LENGTH:
    pBVar2 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar1 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pBVar3 = pBVar2 + 1;
    pBVar4 = pBVar2;
    if (pBVar3 != pBVar1 && pBVar2 != pBVar1) {
      do {
        pBVar2 = pBVar3;
        if ((pBVar3->_length).value <= (pBVar4->_length).value) {
          pBVar2 = pBVar4;
        }
        pBVar3 = pBVar3 + 1;
        pBVar4 = pBVar2;
      } while (pBVar3 != pBVar1);
    }
    break;
  case CRITERION_SIZE:
    pBVar2 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar1 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pBVar3 = pBVar2 + 1;
    pBVar4 = pBVar2;
    if (pBVar3 != pBVar1 && pBVar2 != pBVar1) {
      do {
        pBVar2 = pBVar3;
        if ((ulong)((long)(pBVar3->_pointX).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(pBVar3->_pointX).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start) <=
            (ulong)((long)(pBVar4->_pointX).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(pBVar4->_pointX).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start)) {
          pBVar2 = pBVar4;
        }
        pBVar3 = pBVar3 + 1;
        pBVar4 = pBVar2;
      } while (pBVar3 != pBVar1);
    }
    break;
  case CRITERION_WIDTH:
    pBVar2 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar1 = (this->_blob).
             super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pBVar3 = pBVar2 + 1;
    pBVar4 = pBVar2;
    if (pBVar3 != pBVar1 && pBVar2 != pBVar1) {
      do {
        pBVar2 = pBVar3;
        if ((pBVar3->_width).value <= (pBVar4->_width).value) {
          pBVar2 = pBVar4;
        }
        pBVar3 = pBVar3 + 1;
        pBVar4 = pBVar2;
      } while (pBVar3 != pBVar1);
    }
    break;
  default:
    this_00 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this_00,"Bad criterion for blob finding");
    __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
  }
  return pBVar2;
}

Assistant:

const BlobInfo & BlobDetection::getBestBlob( BlobCriterion criterion ) const
    {
        switch( criterion ) {
            case CRITERION_CIRCULARITY:
                return *(std::max_element( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.circularity() < blob2.circularity(); } ));
            case CRITERION_ELONGATION:
                return *(std::max_element( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.elongation() < blob2.elongation(); } ));
            case CRITERION_HEIGHT:
                return *(std::max_element( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.height() < blob2.height(); } ));
            case CRITERION_LENGTH:
                return *(std::max_element( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.length() < blob2.length(); } ));
            case CRITERION_SIZE:
                return *(std::max_element( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.size() < blob2.size(); } ));
            case CRITERION_WIDTH:
                return *(std::max_element( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.width() < blob2.width(); } ));
            default:
                throw imageException( "Bad criterion for blob finding" );
        }
    }